

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O2

optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>
* __thiscall
Gudhi::ripser::
Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>
::Simplex_boundary_enumerator::next
          (optional<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>
           *__return_storage_ptr__,Simplex_boundary_enumerator *this)

{
  long *plVar1;
  simplex_t *psVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  undefined1 idx [16];
  undefined1 index [16];
  simplex_t sVar6;
  simplex_t sVar7;
  uint uVar8;
  undefined8 in_RAX;
  simplex_t *psVar9;
  simplex_t *psVar10;
  simplex_t *psVar11;
  char k;
  dimension_t k_00;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  undefined8 unaff_RBX;
  simplex_t *psVar12;
  long lVar13;
  bool bVar14;
  value_t vVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  
  uVar16 = (undefined4)in_RAX;
  uVar17 = (undefined4)((ulong)in_RAX >> 0x20);
  bVar14 = -1 < this->k;
  if (bVar14) {
    idx._8_8_ = unaff_RBX;
    idx._0_8_ = in_RAX;
    uVar8 = Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::
            get_max_vertex(this->simplex_encoding,(simplex_t)idx,(dimension_t)(long)this->idx_below,
                           (vertex_t)*(undefined8 *)((long)&this->idx_below + 8));
    this->j = uVar8;
    uVar3 = (ulong)this->idx_above;
    lVar4 = *(long *)((long)&this->idx_above + 8);
    k = this->k + '\x01';
    psVar9 = Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::operator()
                       ((simplex_t *)this->simplex_encoding,
                        (Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>
                         *)(ulong)uVar8,(int)k,k);
    sVar6 = this->idx_below;
    psVar12 = (simplex_t *)(uVar3 + (long)this->idx_below);
    lVar5 = *(long *)((long)&this->idx_below + 8);
    k_00 = this->dim + -1;
    lVar13 = (long)psVar12 - (long)psVar9;
    index._4_4_ = uVar17;
    index._0_4_ = uVar16;
    index._8_8_ = unaff_RBX;
    vVar15 = compute_diameter(this->parent,(simplex_t)index,(dimension_t)lVar13);
    psVar10 = Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::
              operator()((simplex_t *)this->simplex_encoding,
                         (Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>
                          *)(ulong)(uint)this->j,(int)(char)(this->k + '\x01'),k_00);
    psVar11 = *(simplex_t **)&this->idx_below;
    *(long *)&this->idx_below = (long)this->idx_below - (long)psVar10;
    plVar1 = (long *)((long)&this->idx_below + 8);
    *plVar1 = (*plVar1 - extraout_RDX_00) - (ulong)(psVar11 < psVar10);
    psVar11 = Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::
              operator()((simplex_t *)this->simplex_encoding,
                         (Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>
                          *)(ulong)(uint)this->j,(int)this->k,k_00);
    psVar2 = &this->idx_above;
    sVar7 = *psVar2;
    *(long *)psVar2 = (long)*psVar2 + (long)psVar11;
    plVar1 = (long *)((long)&this->idx_above + 8);
    *plVar1 = *plVar1 + extraout_RDX_01 + (ulong)CARRY8((ulong)sVar7,(ulong)psVar11);
    this->k = this->k + -1;
    (__return_storage_ptr__->
    super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t,_true,_true>
    )._M_payload.
    super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>
    ._M_payload._M_value.
    super_pair<float,_Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::entry_plain_t>
    .first = vVar15;
    *(long *)((long)&(__return_storage_ptr__->
                     super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t,_true,_true>
                     )._M_payload.
                     super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>
                     ._M_payload + 0x10) = lVar13;
    *(ulong *)((long)&(__return_storage_ptr__->
                      super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t,_true,_true>
                      )._M_payload.
                      super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>
                      ._M_payload + 0x18) =
         ((lVar4 + lVar5 + (ulong)CARRY8(uVar3,(ulong)sVar6)) - extraout_RDX) -
         (ulong)(psVar12 < psVar9);
  }
  (__return_storage_ptr__->
  super__Optional_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t,_true,_true>
  )._M_payload.
  super__Optional_payload_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>
  ._M_engaged = bVar14;
  return __return_storage_ptr__;
}

Assistant:

std::optional<diameter_entry_t> next() {
        if (!has_next()) return std::nullopt;
        j = simplex_encoding.get_max_vertex(idx_below, k + 1, j);

        simplex_t face_index = idx_above - simplex_encoding(j, k + 1) + idx_below;

        // It would make sense to extract the vertices once in set_simplex
        // and pass the proper subset to compute_diameter, but even in cases
        // where this dominates it does not seem to help (probably because we
        // stop at the first coface).
        value_t face_diameter = parent.compute_diameter(face_index, dim - 1);

        const coefficient_t modulus = parent.modulus;
        coefficient_t face_coefficient =
          (k & 1 ? -1 + modulus : 1) * parent.get_coefficient(simplex) % modulus;

        idx_below -= simplex_encoding(j, k + 1);
        idx_above += simplex_encoding(j, k);

        --k;

        return parent.make_diameter_entry(face_diameter, face_index, face_coefficient);
      }